

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

int doup(void)

{
  boolean bVar1;
  xchar xVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  char *local_18;
  int local_c;
  
  if ((((u.ux == (level->upstair).sx) && (u.uy == (level->upstair).sy)) ||
      (((level->upladder).sx != '\0' &&
       ((u.ux == (level->upladder).sx && (u.uy == (level->upladder).sy)))))) ||
     (((level->sstairs).sx != '\0' &&
      (((u.ux == (level->sstairs).sx && (u.uy == (level->sstairs).sy)) &&
       ((level->sstairs).up != '\0')))))) {
    if ((u.usteed == (monst *)0x0) || ((*(uint *)&(u.usteed)->field_0x60 >> 0x12 & 1) != 0)) {
      if ((u.usteed == (monst *)0x0) || ((u.usteed)->meating == 0)) {
        if (u.ustuck == (monst *)0x0) {
          iVar4 = near_capacity();
          if (iVar4 < 2) {
            xVar2 = ledger_no(&u.uz);
            if ((xVar2 == '\x01') &&
               (cVar3 = yn_function("Beware, there will be no return! Still climb?","yn",'n'),
               cVar3 != 'y')) {
              local_c = 0;
            }
            else {
              bVar1 = next_to_u();
              if (bVar1 == '\0') {
                pline("You are held back by your pet!");
                local_c = 0;
              }
              else {
                at_ladder = level->locations[u.ux][u.uy].typ == '\x1b';
                prev_level('\x01');
                at_ladder = '\0';
                local_c = 1;
              }
            }
          }
          else {
            pcVar5 = "ladder";
            if (level->locations[u.ux][u.uy].typ == '\x1a') {
              pcVar5 = "stairs";
            }
            pline("Your load is too heavy to climb the %s.",pcVar5);
            local_c = 1;
          }
        }
        else {
          if ((u._1052_1_ & 1) == 0) {
            local_18 = "being held";
          }
          else {
            local_18 = "engulfed";
            if (((u.ustuck)->data->mflags1 & 0x40000) != 0) {
              local_18 = "swallowed";
            }
          }
          pline("You are %s, and cannot go up.",local_18);
          local_c = 1;
        }
      }
      else {
        pcVar5 = Monnam(u.usteed);
        pline("%s is still eating.",pcVar5);
        local_c = 0;
      }
    }
    else {
      pcVar5 = Monnam(u.usteed);
      pline("%s won\'t move!",pcVar5);
      local_c = 0;
    }
  }
  else {
    bVar1 = try_escape_trap(u.ux,u.uy,'\0','\0');
    if (bVar1 == '\0') {
      pline("You can\'t go up here.");
      local_c = 0;
    }
    else {
      local_c = 1;
    }
  }
  return local_c;
}

Assistant:

int doup(void)
{
	if ( (u.ux != level->upstair.sx || u.uy != level->upstair.sy)
	     && (!level->upladder.sx || u.ux != level->upladder.sx || u.uy != level->upladder.sy)
	     && (!level->sstairs.sx || u.ux != level->sstairs.sx || u.uy != level->sstairs.sy
			|| !level->sstairs.up)
	  ) {
		if (try_escape_trap(u.ux, u.uy, 0, 0))
			return 1;
		pline("You can't go up here.");
		return 0;
	}
	if (u.usteed && !u.usteed->mcanmove) {
		pline("%s won't move!", Monnam(u.usteed));
		return 0;
	} else if (u.usteed && u.usteed->meating) {
		pline("%s is still eating.", Monnam(u.usteed));
		return 0;
	} else if (u.ustuck) {
		pline("You are %s, and cannot go up.",
			!u.uswallow ? "being held" : is_animal(u.ustuck->data) ?
			"swallowed" : "engulfed");
		return 1;
	}
	if (near_capacity() > SLT_ENCUMBER) {
		/* No levitation check; inv_weight() already allows for it */
		pline("Your load is too heavy to climb the %s.",
			level->locations[u.ux][u.uy].typ == STAIRS ? "stairs" : "ladder");
		return 1;
	}
	if (ledger_no(&u.uz) == 1) {
		if (yn("Beware, there will be no return! Still climb?") != 'y')
			return 0;
	}
	if (!next_to_u()) {
		pline("You are held back by your pet!");
		return 0;
	}
	at_ladder = (boolean) (level->locations[u.ux][u.uy].typ == LADDER);
	prev_level(TRUE);
	at_ladder = FALSE;
	return 1;
}